

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashBinGeneric.h
# Opt level: O0

StatsByIP * __thiscall BinHash<StatsByIP>::Retrieve(BinHash<StatsByIP> *this,StatsByIP *key)

{
  bool bVar1;
  uint32_t uVar2;
  byte local_31;
  StatsByIP *pSStack_20;
  uint32_t hash_index;
  StatsByIP *ret;
  StatsByIP *key_local;
  BinHash<StatsByIP> *this_local;
  
  pSStack_20 = (StatsByIP *)0x0;
  if ((key != (StatsByIP *)0x0) && (this->tableSize != 0)) {
    uVar2 = StatsByIP::Hash(key);
    pSStack_20 = this->hashBin[uVar2 % this->tableSize];
    while( true ) {
      local_31 = 0;
      if (pSStack_20 != (StatsByIP *)0x0) {
        bVar1 = StatsByIP::IsSameKey(key,pSStack_20);
        local_31 = bVar1 ^ 0xff;
      }
      if ((local_31 & 1) == 0) break;
      pSStack_20 = pSStack_20->HashNext;
    }
  }
  return pSStack_20;
}

Assistant:

KeyObj * Retrieve(KeyObj * key)
    {
        KeyObj * ret = 0;

        if (key != 0 && tableSize > 0)
        {
            uint32_t hash_index = key->Hash() % tableSize;

            ret = hashBin[hash_index];

            while (ret != NULL && !key->IsSameKey(ret))
            {
                ret = ret->HashNext;
            }
        }

        return ret;
    }